

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O0

void __thiscall
Js::EngineInterfaceObject::SetEngineExtension
          (EngineInterfaceObject *this,EngineInterfaceExtensionKind extensionKind,
          EngineExtensionObjectBase *extensionObject)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EngineExtensionObjectBase **ppEVar4;
  EngineExtensionObjectBase *extensionObject_local;
  EngineInterfaceExtensionKind extensionKind_local;
  EngineInterfaceObject *this_local;
  
  if (((int)extensionKind < 0) || (2 < (int)extensionKind)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x5a,
                                "(extensionKind >= 0 && extensionKind <= MaxEngineInterfaceExtensionKind)"
                                ,
                                "extensionKind >= 0 && extensionKind <= MaxEngineInterfaceExtensionKind"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((int)extensionKind < 3) {
    ppEVar4 = Memory::WriteBarrierPtr::operator_cast_to_EngineExtensionObjectBase__
                        ((WriteBarrierPtr *)(this->engineExtensions + extensionKind));
    if (*ppEVar4 != (EngineExtensionObjectBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x5d,"(engineExtensions[extensionKind] == nullptr)",
                                  "engineExtensions[extensionKind] == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Memory::WriteBarrierPtr<Js::EngineExtensionObjectBase>::operator=
              (this->engineExtensions + extensionKind,extensionObject);
    bVar2 = IsInitialized(this);
    if (bVar2) {
      (**extensionObject->_vptr_EngineExtensionObjectBase)();
    }
  }
  return;
}

Assistant:

void EngineInterfaceObject::SetEngineExtension(EngineInterfaceExtensionKind extensionKind, EngineExtensionObjectBase* extensionObject)
    {
        AnalysisAssert(extensionKind >= 0 && extensionKind <= MaxEngineInterfaceExtensionKind);
        if (extensionKind <= MaxEngineInterfaceExtensionKind)
        {
            Assert(engineExtensions[extensionKind] == nullptr);
            engineExtensions[extensionKind] = extensionObject;

            // Init the extensionObject if this was already initialized
            if (this->IsInitialized())
            {
                extensionObject->Initialize();
            }
        }
    }